

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall
MutableS2ShapeIndex::InteriorTracker::RestoreStateBefore(InteriorTracker *this,int32 limit_shape_id)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  pointer piVar4;
  pointer __src;
  pointer piVar5;
  
  piVar5 = (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar1) {
    lVar3 = 0;
    do {
      if (limit_shape_id <= *(int *)((long)piVar5 + lVar3)) {
        if (lVar3 == 0) goto LAB_00191808;
        __src = (pointer)((long)piVar5 + lVar3);
        piVar4 = __src;
        if (__src != piVar1) {
          memmove(piVar5,__src,(long)piVar1 + (-lVar3 - (long)piVar5));
          piVar4 = (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        break;
      }
      lVar2 = lVar3 + 4;
      lVar3 = lVar3 + 4;
      piVar4 = piVar1;
      __src = piVar1;
    } while ((pointer)((long)piVar5 + lVar2) != piVar1);
    piVar5 = (pointer)((long)piVar5 + ((long)piVar4 - (long)__src));
    if (piVar4 != piVar5) {
      (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar5;
    }
  }
LAB_00191808:
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&this->shape_ids_,
             (this->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  piVar5 = (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->saved_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar5;
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::InteriorTracker::RestoreStateBefore(
    int32 limit_shape_id) {
  shape_ids_.erase(shape_ids_.begin(), lower_bound(limit_shape_id));
  shape_ids_.insert(shape_ids_.begin(), saved_ids_.begin(), saved_ids_.end());
  saved_ids_.clear();
}